

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger_impl.h
# Opt level: O0

void __thiscall spdlog::async_logger::_sink_it(async_logger *this,log_msg *msg)

{
  bool bVar1;
  pointer paVar2;
  double __x;
  exception *ex;
  log_msg *msg_local;
  async_logger *this_local;
  
  paVar2 = std::
           unique_ptr<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
           ::operator->(&this->_async_log_helper);
  details::async_log_helper::log(paVar2,__x);
  bVar1 = logger::_should_flush_on(&this->super_logger,msg);
  if (bVar1) {
    paVar2 = std::
             unique_ptr<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
             ::operator->(&this->_async_log_helper);
    details::async_log_helper::flush(paVar2,false);
  }
  return;
}

Assistant:

inline void spdlog::async_logger::_sink_it(details::log_msg &msg)
{
    try
    {
#if defined(SPDLOG_ENABLE_MESSAGE_COUNTER)
        _incr_msg_counter(msg);
#endif
        _async_log_helper->log(msg);
        if (_should_flush_on(msg))
        {
            _async_log_helper->flush(false); // do async flush
        }
    }
    catch (const std::exception &ex)
    {
        _err_handler(ex.what());
    }
    catch (...)
    {
        _err_handler("Unknown exception in logger " + _name);
        throw;
    }
}